

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateBlockUpvalueClose
          (ExpressionContext *ctx,SynBase *source,FunctionData *onwerFunction,ScopeData *scope)

{
  Lexeme *allocator;
  TypeBase *type;
  FunctionData *source_00;
  ExprSequence *this;
  CloseUpvaluesData *this_00;
  ArrayView<ExprBase_*> arr;
  IntrusiveList<CloseUpvaluesData> *local_70;
  IntrusiveList<CloseUpvaluesData> *closeUpvalues;
  undefined4 local_38;
  ExprSequence *local_30;
  ExprSequence *holder;
  ScopeData *scope_local;
  FunctionData *onwerFunction_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  holder = (ExprSequence *)scope;
  scope_local = (ScopeData *)onwerFunction;
  onwerFunction_local = (FunctionData *)source;
  source_local = (SynBase *)ctx;
  this = ExpressionContext::get<ExprSequence>(ctx);
  source_00 = onwerFunction_local;
  allocator = source_local[0x229].begin;
  type = *(TypeBase **)&source_local[0x226].listed;
  ArrayView<ExprBase_*>::ArrayView((ArrayView<ExprBase_*> *)&closeUpvalues);
  arr._12_4_ = 0;
  arr.data = (ExprBase **)closeUpvalues;
  arr.count = local_38;
  ExprSequence::ExprSequence(this,(Allocator *)allocator,(SynBase *)source_00,type,arr);
  if (scope_local == (ScopeData *)0x0) {
    local_70 = (IntrusiveList<CloseUpvaluesData> *)&source_local[0x206].end;
  }
  else {
    local_70 = (IntrusiveList<CloseUpvaluesData> *)&scope_local[1].allVariables.allocator;
  }
  local_30 = this;
  this_00 = ExpressionContext::get<CloseUpvaluesData>((ExpressionContext *)source_local);
  CloseUpvaluesData::CloseUpvaluesData
            (this_00,local_30,CLOSE_UPVALUES_BLOCK,(SynBase *)onwerFunction_local,
             (ScopeData *)holder,0);
  IntrusiveList<CloseUpvaluesData>::push_back(local_70,this_00);
  return &local_30->super_ExprBase;
}

Assistant:

ExprBase* CreateBlockUpvalueClose(ExpressionContext &ctx, SynBase *source, FunctionData *onwerFunction, ScopeData *scope)
{
	ExprSequence *holder = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, ctx.typeVoid, ArrayView<ExprBase*>());

	IntrusiveList<CloseUpvaluesData> &closeUpvalues = onwerFunction ? onwerFunction->closeUpvalues : ctx.globalCloseUpvalues;

	closeUpvalues.push_back(new (ctx.get<CloseUpvaluesData>()) CloseUpvaluesData(holder, CLOSE_UPVALUES_BLOCK, source, scope, 0));

	return holder;
}